

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

float Jf_CutCompareArea(Jf_Cut_t *pOld,Jf_Cut_t *pNew)

{
  Jf_Cut_t *pNew_local;
  Jf_Cut_t *pOld_local;
  
  if (pNew->Flow - 0.005 <= pOld->Flow) {
    if (pOld->Flow <= pNew->Flow + 0.005) {
      if (pOld->pCut[0] == pNew->pCut[0]) {
        if (pOld->Time == pNew->Time) {
          pOld_local._4_4_ = 0.0;
        }
        else {
          pOld_local._4_4_ = (float)(pOld->Time - pNew->Time);
        }
      }
      else {
        pOld_local._4_4_ = (float)(pOld->pCut[0] - pNew->pCut[0]);
      }
    }
    else {
      pOld_local._4_4_ = 1.0;
    }
  }
  else {
    pOld_local._4_4_ = -1.0;
  }
  return pOld_local._4_4_;
}

Assistant:

float Jf_CutCompareArea( Jf_Cut_t * pOld, Jf_Cut_t * pNew )
{
//    if ( pOld->Flow    != pNew->Flow    ) return pOld->Flow    - pNew->Flow;
    if ( pOld->Flow < pNew->Flow - JF_EPSILON ) return -1;
    if ( pOld->Flow > pNew->Flow + JF_EPSILON ) return 1;
    if ( pOld->pCut[0] != pNew->pCut[0] ) return pOld->pCut[0] - pNew->pCut[0];
    if ( pOld->Time    != pNew->Time    ) return pOld->Time    - pNew->Time;
    return 0;
}